

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba.cc
# Opt level: O2

void jieba_add_user_word(jieba_t *handle,char *word)

{
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,word,&local_49);
  std::__cxx11::string::string((string *)&local_48,"",&local_4a);
  cppjieba::DictTrie::InsertUserWord((DictTrie *)handle,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void jieba_add_user_word(jieba_t* handle, const char* word) {
  ((cppjieba::Jieba*)handle)->InsertUserWord(word);
}